

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall lr_grammar::GrammarLR::create_dfa_states(GrammarLR *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  reference this_00;
  size_type sVar8;
  Express *this_01;
  int *piVar9;
  DFAState local_d8;
  int local_b0;
  int local_ac;
  int i_1;
  int countIndex;
  int elemIndex;
  Project tmp;
  int i;
  int stateIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [36];
  Project local_34;
  undefined1 local_28 [8];
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> projects;
  GrammarLR *this_local;
  
  projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::vector
            ((vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28);
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,0);
  std::operator+(local_58,(char *)&(pvVar3->super_Elem).name);
  iVar2 = find_name(this,local_58);
  Project::Project(&local_34,iVar2,0,0);
  std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::push_back
            ((vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28,&local_34
            );
  std::__cxx11::string::~string((string *)local_58);
  closure(this,(vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28);
  sVar4 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                    (&this->elements);
  DFAState::DFAState((DFAState *)&i,
                     (vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28,0
                     ,(int)sVar4);
  std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::push_back
            (&this->states,(value_type *)&i);
  DFAState::~DFAState((DFAState *)&i);
  tmp.projectPoint = 0;
  do {
    uVar5 = (ulong)tmp.projectPoint;
    sVar4 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::size
                      (&this->states);
    if (sVar4 <= uVar5) {
      std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::~vector
                ((vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28);
      return;
    }
    tmp.expressIndex = 0;
    while( true ) {
      uVar5 = (ulong)tmp.expressIndex;
      pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::operator[]
                         (&this->states,(long)tmp.projectPoint);
      sVar4 = std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::size
                        (&pvVar6->projects);
      if (sVar4 <= uVar5) break;
      pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::operator[]
                         (&this->states,(long)tmp.projectPoint);
      pvVar7 = std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::operator[]
                         (&pvVar6->projects,(long)tmp.expressIndex);
      countIndex = pvVar7->elemKey;
      elemIndex = pvVar7->expressIndex;
      tmp.elemKey = pvVar7->projectPoint;
      sVar4 = (size_type)tmp.elemKey;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)countIndex);
      this_00 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                operator[](&pvVar3->expression_of_set,(long)elemIndex);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)this_00);
      if (sVar4 != sVar8) {
        pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)countIndex);
        this_01 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                   operator[](&pvVar3->expression_of_set,(long)elemIndex)->super_Express;
        piVar9 = base_grammar::Express::operator[](this_01,tmp.elemKey);
        i_1 = *piVar9;
        pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                 operator[](&this->states,(long)tmp.projectPoint);
        if (pvVar6->next[i_1] == -1) {
          pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                   operator[](&this->states,(long)tmp.projectPoint);
          smove(this,pvVar6,i_1,
                (vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28);
          closure(this,(vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)local_28
                 );
          sVar4 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::size
                            (&this->states);
          local_ac = (int)sVar4;
          for (local_b0 = 0; uVar5 = (ulong)local_b0,
              sVar4 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::size
                                (&this->states), uVar5 < sVar4; local_b0 = local_b0 + 1) {
            pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                     operator[](&this->states,(long)local_b0);
            bVar1 = DFAState::operator==
                              (pvVar6,(vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                       *)local_28);
            if (bVar1) {
              local_ac = local_b0;
              break;
            }
          }
          sVar4 = (size_type)local_ac;
          sVar8 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::size
                            (&this->states);
          iVar2 = local_ac;
          if (sVar4 == sVar8) {
            sVar4 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                              (&this->elements);
            DFAState::DFAState(&local_d8,
                               (vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *)
                               local_28,iVar2,(int)sVar4);
            std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::push_back
                      (&this->states,&local_d8);
            DFAState::~DFAState(&local_d8);
          }
          iVar2 = local_ac;
          pvVar6 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                   operator[](&this->states,(long)tmp.projectPoint);
          pvVar6->next[i_1] = iVar2;
        }
      }
      tmp.expressIndex = tmp.expressIndex + 1;
    }
    tmp.projectPoint = tmp.projectPoint + 1;
  } while( true );
}

Assistant:

void GrammarLR::create_dfa_states(){


    //开始计算,项目的点的下标是下一个
    //项目A->.abb 点的位置为0
    vector<Project> projects;
    projects.push_back(Project(find_name(elements[0].name + "'"), 0, 0));
    closure(projects);

    this->states.push_back(DFAState(projects, 0, elements.size()));


    //开始计算
    //S0是0下标，持续增长的
    for (int stateIndex = 0; stateIndex < this->states.size(); stateIndex++){

        //每一个状态的smove都要计算一下，针对是每一个项目集合，不用针对所有的元素
        for (int i = 0; i < states[stateIndex].projects.size(); i++){

            Project tmp = states[stateIndex].projects[i];

            //这是一个可移进后面没有smove了
            if (tmp.projectPoint == elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size()){
                continue;
            }
            //.后面的数的元素
            int elemIndex = elements[tmp.elemKey].expression_of_set[tmp.expressIndex][tmp.projectPoint];

            //先判断这个元素是不是已经计算了,不是-1已经计算了
            if (states[stateIndex].next[elemIndex] != -1) continue;

            //计算smove;
            smove(states[stateIndex], elemIndex, projects);

            //计算空闭包
            closure(projects);

            int countIndex = states.size();
            //看看这个状态是不是已经出现过了
            for (int i = 0; i < states.size(); i++){

                if (states[i] == projects){
                    countIndex = i;
                    break;
                }
            }

            //新状态，需要被push
            if (countIndex == states.size()){
                states.push_back(DFAState(projects, countIndex, elements.size()));
            }

            //给原来的状态进行调整
            states[stateIndex].next[elemIndex] = countIndex;

        }

    }


}